

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
::insert_multi<std::pair<int,int>const&>
          (btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
           *this,key_type *key,pair<int,_int> *v)

{
  bool bVar1;
  node_type *pnVar2;
  node_type **ppnVar3;
  iterator iVar4;
  iterator iVar5;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
  *pbStack_40;
  iterator iter;
  pair<int,_int> *v_local;
  key_type *key_local;
  btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
  *this_local;
  
  bVar1 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
          ::empty((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                   *)this);
  if (bVar1) {
    pnVar2 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar2;
    ppnVar3 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
              ::mutable_root((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                              *)this);
    *ppnVar3 = pnVar2;
  }
  iVar4 = internal_upper_bound<std::pair<int,int>>(this,key);
  pbStack_40 = iVar4.node;
  iter.node._0_4_ = iVar4.position;
  if (pbStack_40 ==
      (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
       *)0x0) {
    iVar4 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
            ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                   *)this);
    pbStack_40 = iVar4.node;
    iter.node._0_4_ = iVar4.position;
  }
  iVar4.position = (int)iter.node;
  iVar4.node = pbStack_40;
  iVar4._12_4_ = 0;
  iVar4 = internal_emplace<std::pair<int,int>const&>(this,iVar4,v);
  iVar5._12_4_ = 0;
  iVar5.node = (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>
                *)SUB128(iVar4._0_12_,0);
  iVar5.position = SUB124(iVar4._0_12_,8);
  return iVar5;
}

Assistant:

auto btree<P>::insert_multi(const key_type &key, ValueType &&v) -> iterator {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        iterator iter = internal_upper_bound(key);
        if (iter.node == nullptr) {
            iter = end();
        }
        return internal_emplace(iter, std::forward<ValueType>(v));
    }